

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.hpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLReader::movePlainContentChars(XMLReader *this,XMLBuffer *dest)

{
  XMLSize_t XVar1;
  XMLSize_t XVar2;
  XMLSize_t count;
  
  XVar2 = this->fCharsAvail - this->fCharIndex;
  XVar1 = 0;
  while ((count = XVar2, XVar2 != XVar1 &&
         (count = XVar1,
         (this->fgCharCharsTable[(ushort)(this->fCharBuf + this->fCharIndex)[XVar1]] & 8) != 0))) {
    XVar1 = XVar1 + 1;
  }
  if (count != 0) {
    XMLBuffer::append(dest,this->fCharBuf + this->fCharIndex,count);
    this->fCharIndex = this->fCharIndex + count;
    this->fCurCol = this->fCurCol + count;
  }
  return;
}

Assistant:

inline void XMLReader::movePlainContentChars(XMLBuffer &dest)
{
    const XMLSize_t chunkSize = fCharsAvail - fCharIndex;
    const XMLCh* cursor = &fCharBuf[fCharIndex];
    XMLSize_t count=0;
    for(;count<chunkSize && (fgCharCharsTable[*cursor++] & gPlainContentCharMask) != 0;++count) /*noop*/ ;

    if (count!=0)
    {
        dest.append(&fCharBuf[fCharIndex], count);
        fCharIndex += count;
        fCurCol    += (XMLFileLoc)count;
    }
}